

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O1

date_t duckdb::MakeDateOperator::Operation<long,long,long,duckdb::date_t>(long yyyy,long mm,long dd)

{
  int32_t year;
  int32_t month;
  bool bVar1;
  date_t dVar2;
  undefined1 auVar3 [16];
  int result;
  int32_t local_4c;
  string local_48;
  
  bVar1 = TryCast::Operation<long,int>(yyyy,&local_4c,false);
  year = local_4c;
  if (!bVar1) {
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_48,(duckdb *)yyyy,auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,&local_48);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryCast::Operation<long,int>(mm,&local_4c,false);
  month = local_4c;
  if (bVar1) {
    bVar1 = TryCast::Operation<long,int>(dd,&local_4c,false);
    if (bVar1) {
      dVar2 = Date::FromDate(year,month,local_4c);
      return (date_t)dVar2.days;
    }
    auVar3 = __cxa_allocate_exception(0x10);
    CastExceptionText<long,int>(&local_48,(duckdb *)dd,auVar3._8_8_);
    InvalidInputException::InvalidInputException(auVar3._0_8_,&local_48);
    __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,int>(&local_48,(duckdb *)mm,auVar3._8_8_);
  InvalidInputException::InvalidInputException(auVar3._0_8_,&local_48);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(YYYY yyyy, MM mm, DD dd) {
		return Date::FromDate(Cast::Operation<YYYY, int32_t>(yyyy), Cast::Operation<MM, int32_t>(mm),
		                      Cast::Operation<DD, int32_t>(dd));
	}